

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkCanBeSimplified(CheckerVisitor *this,TerExpr *expr)

{
  Expr *pEVar1;
  long lVar2;
  bool bVar3;
  undefined8 in_RAX;
  Node *lhs;
  Node *rhs;
  Expr *pEVar4;
  int32_t dummy;
  int32_t dummy_1;
  int32_t local_28;
  int32_t local_24;
  
  if (this->effectsOnly != false) {
    return;
  }
  pEVar4 = expr->_a;
  if ((pEVar4->super_Node)._op == TO_NE) {
    pEVar1 = (Expr *)pEVar4[1].super_Node.super_ArenaObj._vptr_ArenaObj;
    if (((pEVar1->super_Node)._op == TO_LITERAL) && (*(int *)&(pEVar1->super_Node).field_0x1c == 4))
    {
      pEVar4 = *(Expr **)&pEVar4[1].super_Node._coordinates;
      goto LAB_001519d2;
    }
    lVar2 = *(long *)&pEVar4[1].super_Node._coordinates;
    if (*(int *)(lVar2 + 0x18) == 0x39) {
      pEVar4 = (Expr *)0x0;
      if (*(int *)(lVar2 + 0x1c) == 4) {
        pEVar4 = pEVar1;
      }
      goto LAB_001519d2;
    }
  }
  pEVar4 = (Expr *)0x0;
LAB_001519d2:
  if (((pEVar4 != (Expr *)0x0) && ((expr->_c->super_Node)._op == TO_LITERAL)) &&
     (*(int *)&(expr->_c->super_Node).field_0x1c == 4)) {
    _local_28 = CONCAT44((int32_t)((ulong)in_RAX >> 0x20),0xffffffff);
    lhs = &maybeEval(this,pEVar4,&local_28,false)->super_Node;
    _local_28 = CONCAT44(0xffffffff,local_28);
    rhs = &maybeEval(this,expr->_b,&local_24,false)->super_Node;
    bVar3 = NodeEqualChecker::check((NodeEqualChecker *)&this->field_0x20,lhs,rhs);
    if (bVar3) {
      report(this,(Node *)expr,0x79);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCanBeSimplified(const TerExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *cond = expr->a();
  const Expr *checkee = nullptr;


  if (cond->op() == TO_NE) {
    const BinExpr *b = static_cast<const BinExpr *>(cond);

    if (b->lhs()->op() == TO_LITERAL && b->lhs()->asLiteral()->kind() == LK_NULL)
      checkee = b->rhs();
    else if (b->rhs()->op() == TO_LITERAL && b->rhs()->asLiteral()->kind() == LK_NULL)
      checkee = b->lhs();
  }

  if (!checkee)
    return;

  if (expr->c()->op() != TO_LITERAL || expr->c()->asLiteral()->kind() != LK_NULL)
    return;

  checkee = maybeEval(checkee);
  const Expr *t = maybeEval(expr->b());

  if (_equalChecker.check(checkee, t)) {
    report(expr, DiagnosticsId::DI_CAN_BE_SIMPLIFIED);
  }
}